

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pass2.cpp
# Opt level: O0

string * __thiscall
cs222::Pass2::binaryToHex(string *__return_storage_ptr__,Pass2 *this,string *binaryValue)

{
  int iVar1;
  char cVar2;
  ulong uVar3;
  ulong uVar4;
  char *pcVar5;
  ostream *this_00;
  stringstream local_1b8 [8];
  stringstream ss;
  ostream local_1a8 [376];
  ulong local_30;
  size_t count;
  int result;
  int hexLength;
  string *binaryValue_local;
  Pass2 *this_local;
  string *hexVal;
  
  _result = binaryValue;
  binaryValue_local = (string *)this;
  this_local = (Pass2 *)__return_storage_ptr__;
  uVar3 = std::__cxx11::string::length();
  count._4_4_ = (int)(uVar3 >> 2);
  count._0_4_ = 0;
  for (local_30 = 0; uVar3 = local_30, uVar4 = std::__cxx11::string::length(), uVar3 < uVar4;
      local_30 = local_30 + 1) {
    count._0_4_ = (int)count << 1;
    pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)binaryValue);
    count._0_4_ = (uint)(*pcVar5 == '1') + (int)count;
  }
  std::__cxx11::stringstream::stringstream(local_1b8);
  this_00 = (ostream *)std::ostream::operator<<(local_1a8,std::hex);
  std::ostream::operator<<(this_00,(int)count);
  std::__cxx11::stringstream::str();
  uVar3 = std::__cxx11::string::length();
  iVar1 = count._4_4_;
  if (uVar3 < (ulong)(long)count._4_4_) {
    cVar2 = std::__cxx11::string::length();
    std::__cxx11::string::insert((ulong)__return_storage_ptr__,0,(char)iVar1 - cVar2);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string Pass2::binaryToHex(std::string binaryValue)
    {
        int hexLength = binaryValue.length() / 4;
        int result =0 ;
        for(size_t count = 0; count < binaryValue.length() ; ++count)
        {
            result *=2;
            result += binaryValue[count]=='1'? 1 :0;
        }

        std::stringstream ss;
        ss << std::hex  << result;

        std::string hexVal(ss.str());
        if (hexVal.length() < hexLength)
        {
            hexVal.insert(0, hexLength-hexVal.length(), '0');
        }
        return hexVal;
    }